

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O3

TaskExecutionResult __thiscall
duckdb::UngroupedDistinctAggregateFinalizeTask::AggregateDistinct
          (UngroupedDistinctAggregateFinalizeTask *this)

{
  _Atomic_word *p_Var1;
  idx_t *__k;
  unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true> *this_00
  ;
  DataChunk *this_01;
  PhysicalUngroupedAggregate *pPVar2;
  size_type __n;
  _Head_base<0UL,_duckdb::LocalSourceState_*,_false> _Var3;
  ClientContext *context;
  bool bVar4;
  undefined8 uVar5;
  SourceResultType SVar6;
  bool bVar7;
  int iVar8;
  type pDVar9;
  type distinct_data;
  UngroupedDistinctAggregateFinalizeEvent *this_02;
  const_reference this_03;
  pointer this_04;
  BoundAggregateExpression *pBVar10;
  const_iterator cVar11;
  reference this_05;
  type this_06;
  pointer pVVar12;
  reference this_07;
  reference this_08;
  reference this_09;
  pointer this_10;
  reference this_11;
  pointer pGVar13;
  reference this_12;
  reference other;
  TaskExecutionResult TVar14;
  ulong __n_00;
  size_type __n_01;
  long lVar15;
  ExecutionContext execution_context;
  DataChunk output_chunk;
  OperatorSourceInput source_input;
  InterruptState interrupt_state;
  DataChunk payload_chunk;
  ThreadContext thread_context;
  weak_ptr<duckdb::Task,_true> local_1f8;
  vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
  *local_1e8;
  vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
  *local_1e0;
  enable_shared_from_this<duckdb::Task> *local_1d8;
  vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
  *local_1d0;
  vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
  *local_1c8;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_1c0;
  type local_1b8;
  ExecutionContext local_1b0;
  undefined1 local_198 [88];
  undefined1 local_140 [64];
  pointer local_100;
  ThreadContext local_d8;
  
  pDVar9 = unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
           ::operator*(&this->gstate->distinct_state);
  distinct_data =
       unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
       ::operator*(&this->op->distinct_data);
  pPVar2 = this->op;
  ThreadContext::ThreadContext(&local_d8,((this->super_ExecutorTask).executor)->context);
  local_1b0.client = ((this->super_ExecutorTask).executor)->context;
  local_1b0.pipeline.ptr = (Pipeline *)0x0;
  local_1b0.thread = &local_d8;
  this_02 = (UngroupedDistinctAggregateFinalizeEvent *)
            shared_ptr<duckdb::Event,_true>::operator->(&(this->super_ExecutorTask).event);
  __n_00 = this->aggregation_idx;
  if (__n_00 < (ulong)((long)(pPVar2->aggregates).
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pPVar2->aggregates).
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    local_1c0 = &pPVar2->aggregates;
    __k = &this->aggregation_idx;
    local_1c8 = &distinct_data->radix_tables;
    this_00 = &this->radix_table_lstate;
    local_1d0 = &pDVar9->radix_states;
    local_1d8 = &(this->super_ExecutorTask).super_Task.super_enable_shared_from_this<duckdb::Task>;
    local_1e0 = &this_02->global_source_states;
    local_1e8 = &pDVar9->distinct_output_chunks;
    this_01 = (DataChunk *)(local_140 + 0x28);
    do {
      this_03 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](local_1c0,__n_00);
      this_04 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(this_03);
      pBVar10 = BaseExpression::Cast<duckdb::BoundAggregateExpression>
                          (&this_04->super_BaseExpression);
      local_198._0_8_ = *__k;
      if ((distinct_data->radix_tables).
          super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (distinct_data->radix_tables).
          super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        cVar11 = ::std::
                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(distinct_data->info->table_map)._M_h,(key_type *)local_198);
        if (cVar11.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
            _M_cur != (__node_type *)0x0) {
          cVar11 = ::std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(distinct_data->info->table_map)._M_h,__k);
          if (cVar11.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
              ._M_cur == (__node_type *)0x0) {
            ::std::__throw_out_of_range("_Map_base::at");
          }
          __n = *(size_type *)
                 ((long)cVar11.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                        ._M_cur + 0x10);
          this_05 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                    ::operator[](local_1c8,__n);
          this_06 = unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                    ::operator*(this_05);
          if (this->blocked == false) {
            RadixPartitionedHashTable::GetLocalSourceState
                      ((RadixPartitionedHashTable *)local_198,(ExecutionContext *)this_06);
            uVar5 = local_198._0_8_;
            local_198._0_8_ = (element_type *)0x0;
            _Var3._M_head_impl =
                 (this_00->
                 super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
                 .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl;
            (this_00->
            super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
            .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl =
                 (LocalSourceState *)uVar5;
            if (_Var3._M_head_impl != (LocalSourceState *)0x0) {
              (*(_Var3._M_head_impl)->_vptr_LocalSourceState[1])();
              if ((element_type *)local_198._0_8_ != (element_type *)0x0) {
                (*(*(_func_int ***)&((_Rep_type *)local_198._0_8_)->_M_impl)[1])();
              }
            }
          }
          pVVar12 = (pointer)unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
                             ::operator*(this_00);
          this_07 = vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                    ::operator[](local_1d0,__n);
          local_1b8 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                      ::operator*(this_07);
          enable_shared_from_this<duckdb::Task>::shared_from_this
                    ((enable_shared_from_this<duckdb::Task> *)local_198);
          local_1f8.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_198._0_8_;
          local_1f8.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_198._8_8_ + 0xc) =
                   *(_Atomic_word *)(local_198._8_8_ + 0xc) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_198._8_8_ + 0xc) =
                   *(_Atomic_word *)(local_198._8_8_ + 0xc) + 1;
            }
          }
          InterruptState::InterruptState((InterruptState *)local_140,&local_1f8);
          if (local_1f8.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1 = &(local_1f8.internal.
                         super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_M_weak_count;
              iVar8 = *p_Var1;
              *p_Var1 = *p_Var1 + -1;
              UNLOCK();
            }
            else {
              iVar8 = (local_1f8.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_weak_count;
              (local_1f8.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count = iVar8 + -1;
            }
            if (iVar8 == 1) {
              (*(local_1f8.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
          }
          this_08 = vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
                    ::operator[](local_1e0,*__k);
          local_198._64_8_ =
               unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
               ::operator*(this_08);
          local_198._80_8_ = local_140;
          local_198._72_8_ = pVVar12;
          DataChunk::DataChunk((DataChunk *)local_198);
          context = ((this->super_ExecutorTask).executor)->context;
          this_09 = vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
                    ::operator[](local_1e8,__n);
          this_10 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                    operator->(this_09);
          DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)this_01,this_10);
          DataChunk::Initialize
                    ((DataChunk *)local_198,context,(vector<duckdb::LogicalType,_true> *)this_01,
                     0x800);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_01);
          DataChunk::DataChunk(this_01);
          this_11 = vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_true>
                    ::operator[](&distinct_data->grouped_aggregate_data,__n);
          pGVar13 = unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>
                    ::operator->(this_11);
          DataChunk::InitializeEmpty(this_01,&pGVar13->group_types);
          local_100 = (pointer)0x0;
          while( true ) {
            DataChunk::Reset((DataChunk *)local_198);
            SVar6 = RadixPartitionedHashTable::GetData
                              (this_06,&local_1b0,(DataChunk *)local_198,local_1b8,
                               (OperatorSourceInput *)(local_198 + 0x40));
            if (SVar6 == FINISHED) break;
            if (SVar6 == BLOCKED) {
              bVar7 = true;
              bVar4 = false;
              goto LAB_016456fa;
            }
            lVar15 = (long)(pBVar10->children).
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pBVar10->children).
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            if (lVar15 != 0) {
              lVar15 = lVar15 >> 3;
              __n_01 = 0;
              do {
                this_12 = vector<duckdb::Vector,_true>::operator[]
                                    ((vector<duckdb::Vector,_true> *)this_01,__n_01);
                other = vector<duckdb::Vector,_true>::operator[]
                                  ((vector<duckdb::Vector,_true> *)local_198,__n_01);
                Vector::Reference(this_12,other);
                __n_01 = __n_01 + 1;
              } while (lVar15 + (ulong)(lVar15 == 0) != __n_01);
            }
            local_100 = (pointer)local_198._24_8_;
            LocalUngroupedAggregateState::Sink(&this->aggregate_state,this_01,0,*__k);
          }
          bVar4 = true;
          bVar7 = false;
LAB_016456fa:
          this->blocked = bVar7;
          DataChunk::~DataChunk(this_01);
          DataChunk::~DataChunk((DataChunk *)local_198);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._32_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1 = (_Atomic_word *)(local_140._32_8_ + 0xc);
              iVar8 = *p_Var1;
              *p_Var1 = *p_Var1 + -1;
              UNLOCK();
            }
            else {
              iVar8 = *(_Atomic_word *)(local_140._32_8_ + 0xc);
              *(int *)(local_140._32_8_ + 0xc) = iVar8 + -1;
            }
            if (iVar8 == 1) {
              (**(code **)(*(long *)local_140._32_8_ + 0x18))();
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1 = (_Atomic_word *)(local_140._16_8_ + 0xc);
              iVar8 = *p_Var1;
              *p_Var1 = *p_Var1 + -1;
              UNLOCK();
            }
            else {
              iVar8 = *(_Atomic_word *)(local_140._16_8_ + 0xc);
              *(int *)(local_140._16_8_ + 0xc) = iVar8 + -1;
            }
            if (iVar8 == 1) {
              (*(*(_func_int ***)local_140._16_8_)[3])();
            }
          }
          if (!bVar4) {
            TVar14 = TASK_BLOCKED;
            goto LAB_016457df;
          }
        }
      }
      __n_00 = *__k + 1;
      *__k = __n_00;
    } while (__n_00 < (ulong)((long)(pPVar2->aggregates).
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pPVar2->aggregates).
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  GlobalUngroupedAggregateState::CombineDistinct
            (&this->gstate->state,&this->aggregate_state,distinct_data);
  UngroupedDistinctAggregateFinalizeEvent::FinalizeTask(this_02);
  TVar14 = TASK_FINISHED;
LAB_016457df:
  ThreadContext::~ThreadContext(&local_d8);
  return TVar14;
}

Assistant:

TaskExecutionResult UngroupedDistinctAggregateFinalizeTask::AggregateDistinct() {
	D_ASSERT(gstate.distinct_state);
	auto &distinct_state = *gstate.distinct_state;
	auto &distinct_data = *op.distinct_data;

	auto &aggregates = op.aggregates;
	auto &state = aggregate_state;

	// Thread-local contexts
	ThreadContext thread_context(executor.context);
	ExecutionContext execution_context(executor.context, thread_context, nullptr);

	auto &finalize_event = event->Cast<UngroupedDistinctAggregateFinalizeEvent>();

	// Now loop through the distinct aggregates, scanning the distinct HTs

	// This needs to be preserved in case the radix_table.GetData blocks
	auto &agg_idx = aggregation_idx;

	for (; agg_idx < aggregates.size(); agg_idx++) {
		auto &aggregate = aggregates[agg_idx]->Cast<BoundAggregateExpression>();

		// If aggregate is not distinct, skip it
		if (!distinct_data.IsDistinct(agg_idx)) {
			continue;
		}

		const auto table_idx = distinct_data.info.table_map.at(agg_idx);
		auto &radix_table = *distinct_data.radix_tables[table_idx];
		if (!blocked) {
			// Because we can block, we need to make sure we preserve this state
			radix_table_lstate = radix_table.GetLocalSourceState(execution_context);
		}
		auto &lstate = *radix_table_lstate;

		auto &sink = *distinct_state.radix_states[table_idx];
		InterruptState interrupt_state(shared_from_this());
		OperatorSourceInput source_input {*finalize_event.global_source_states[agg_idx], lstate, interrupt_state};

		DataChunk output_chunk;
		output_chunk.Initialize(executor.context, distinct_state.distinct_output_chunks[table_idx]->GetTypes());

		DataChunk payload_chunk;
		payload_chunk.InitializeEmpty(distinct_data.grouped_aggregate_data[table_idx]->group_types);
		payload_chunk.SetCardinality(0);

		while (true) {
			output_chunk.Reset();

			auto res = radix_table.GetData(execution_context, output_chunk, sink, source_input);
			if (res == SourceResultType::FINISHED) {
				D_ASSERT(output_chunk.size() == 0);
				break;
			} else if (res == SourceResultType::BLOCKED) {
				blocked = true;
				return TaskExecutionResult::TASK_BLOCKED;
			}

			// We dont need to resolve the filter, we already did this in Sink
			idx_t payload_cnt = aggregate.children.size();
			for (idx_t i = 0; i < payload_cnt; i++) {
				payload_chunk.data[i].Reference(output_chunk.data[i]);
			}
			payload_chunk.SetCardinality(output_chunk);

			// Update the aggregate state
			state.Sink(payload_chunk, 0, agg_idx);
		}
		blocked = false;
	}

	// After scanning the distinct HTs, we can combine the thread-local agg states with the thread-global
	gstate.state.CombineDistinct(state, distinct_data);
	finalize_event.FinalizeTask();
	return TaskExecutionResult::TASK_FINISHED;
}